

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMiMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Scene *pSVar5;
  Geometry *pGVar6;
  long lVar7;
  RTCFilterFunctionN p_Var8;
  undefined1 auVar9 [32];
  int iVar10;
  AABBNodeMB4D *node1;
  ulong uVar11;
  uint uVar12;
  ulong *puVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  vint4 bi;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  vint4 ai;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  float fVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar65;
  float fVar66;
  float fVar67;
  undefined1 auVar64 [64];
  uint uVar69;
  uint uVar70;
  uint uVar71;
  undefined1 auVar68 [64];
  undefined1 auVar72 [16];
  undefined1 auVar73 [64];
  undefined1 auVar74 [16];
  undefined1 auVar75 [64];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  ulong *local_c00;
  RTCFilterFunctionNArguments local_b50;
  undefined1 local_b20 [32];
  undefined1 local_af0 [16];
  undefined1 local_ae0 [16];
  undefined1 local_ad0 [16];
  undefined1 local_ac0 [16];
  undefined1 local_ab0 [16];
  undefined1 local_aa0 [16];
  undefined1 local_a90 [16];
  undefined1 local_a80 [16];
  undefined1 local_a70 [16];
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 local_a10;
  undefined8 uStack_a08;
  undefined1 local_a00 [16];
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9b0 [16];
  float local_9a0 [4];
  undefined1 local_990 [16];
  float local_980 [4];
  undefined1 local_970 [16];
  undefined1 local_960 [16];
  undefined1 local_950 [16];
  undefined1 local_940 [32];
  RTCHitN local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined4 local_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_800 = root.ptr;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_a80._4_4_ = fVar2;
  local_a80._0_4_ = fVar2;
  local_a80._8_4_ = fVar2;
  local_a80._12_4_ = fVar2;
  auVar50 = ZEXT1664(local_a80);
  fVar60 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_a90._4_4_ = fVar60;
  local_a90._0_4_ = fVar60;
  local_a90._8_4_ = fVar60;
  local_a90._12_4_ = fVar60;
  auVar54 = ZEXT1664(local_a90);
  fVar65 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_aa0._4_4_ = fVar65;
  local_aa0._0_4_ = fVar65;
  local_aa0._8_4_ = fVar65;
  local_aa0._12_4_ = fVar65;
  auVar55 = ZEXT1664(local_aa0);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar60 = fVar60 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar65 = fVar65 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar20 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_a70._8_4_ = 0x80000000;
  local_a70._0_8_ = 0x8000000080000000;
  local_a70._12_4_ = 0x80000000;
  local_ab0._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_ab0._8_4_ = -fVar2;
  local_ab0._12_4_ = -fVar2;
  auVar59 = ZEXT1664(local_ab0);
  local_ac0._0_8_ = CONCAT44(fVar60,fVar60) ^ 0x8000000080000000;
  local_ac0._8_4_ = -fVar60;
  local_ac0._12_4_ = -fVar60;
  auVar64 = ZEXT1664(local_ac0);
  iVar10 = (tray->tnear).field_0.i[k];
  local_ad0._4_4_ = iVar10;
  local_ad0._0_4_ = iVar10;
  local_ad0._8_4_ = iVar10;
  local_ad0._12_4_ = iVar10;
  auVar68 = ZEXT1664(local_ad0);
  local_ae0._0_8_ = CONCAT44(fVar65,fVar65) ^ 0x8000000080000000;
  local_ae0._8_4_ = -fVar65;
  local_ae0._12_4_ = -fVar65;
  auVar73 = ZEXT1664(local_ae0);
  iVar10 = (tray->tfar).field_0.i[k];
  local_af0._4_4_ = iVar10;
  local_af0._0_4_ = iVar10;
  local_af0._8_4_ = iVar10;
  local_af0._12_4_ = iVar10;
  auVar75 = ZEXT1664(local_af0);
  iVar10 = 1 << ((uint)k & 0x1f);
  auVar39._4_4_ = iVar10;
  auVar39._0_4_ = iVar10;
  auVar39._8_4_ = iVar10;
  auVar39._12_4_ = iVar10;
  auVar39._16_4_ = iVar10;
  auVar39._20_4_ = iVar10;
  auVar39._24_4_ = iVar10;
  auVar39._28_4_ = iVar10;
  auVar9 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar39 = vpand_avx2(auVar39,auVar9);
  local_940 = vpcmpeqd_avx2(auVar39,auVar9);
  local_c00 = local_7f8;
LAB_015efd4d:
  do {
    puVar13 = local_c00;
    if (puVar13 == &local_800) {
LAB_015f0755:
      return puVar13 != &local_800;
    }
    local_c00 = puVar13 + -1;
    uVar19 = puVar13[-1];
    while ((uVar19 & 8) == 0) {
      uVar11 = uVar19 & 0xfffffffffffffff0;
      uVar3 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar32._4_4_ = uVar3;
      auVar32._0_4_ = uVar3;
      auVar32._8_4_ = uVar3;
      auVar32._12_4_ = uVar3;
      auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x80 + uVar23),auVar32,
                                *(undefined1 (*) [16])(uVar11 + 0x20 + uVar23));
      auVar33 = vfmadd213ps_fma(auVar33,auVar50._0_16_,auVar59._0_16_);
      auVar38 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x80 + uVar29),auVar32,
                                *(undefined1 (*) [16])(uVar11 + 0x20 + uVar29));
      auVar38 = vfmadd213ps_fma(auVar38,auVar54._0_16_,auVar64._0_16_);
      auVar33 = vpmaxsd_avx(auVar33,auVar38);
      auVar38 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x80 + uVar20),auVar32,
                                *(undefined1 (*) [16])(uVar11 + 0x20 + uVar20));
      auVar38 = vfmadd213ps_fma(auVar38,auVar55._0_16_,auVar73._0_16_);
      auVar38 = vpmaxsd_avx(auVar38,auVar68._0_16_);
      auVar33 = vpmaxsd_avx(auVar33,auVar38);
      auVar38 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x80 + (uVar23 ^ 0x10)),auVar32,
                                *(undefined1 (*) [16])(uVar11 + 0x20 + (uVar23 ^ 0x10)));
      auVar38 = vfmadd213ps_fma(auVar38,auVar50._0_16_,auVar59._0_16_);
      auVar34 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x80 + (uVar29 ^ 0x10)),auVar32,
                                *(undefined1 (*) [16])(uVar11 + 0x20 + (uVar29 ^ 0x10)));
      auVar34 = vfmadd213ps_fma(auVar34,auVar54._0_16_,auVar64._0_16_);
      auVar38 = vpminsd_avx(auVar38,auVar34);
      auVar34 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x80 + (uVar20 ^ 0x10)),auVar32,
                                *(undefined1 (*) [16])(uVar11 + 0x20 + (uVar20 ^ 0x10)));
      auVar34 = vfmadd213ps_fma(auVar34,auVar55._0_16_,auVar73._0_16_);
      auVar34 = vpminsd_avx(auVar34,auVar75._0_16_);
      auVar38 = vpminsd_avx(auVar38,auVar34);
      if (((uint)uVar19 & 7) == 6) {
        auVar38 = vcmpps_avx(auVar33,auVar38,2);
        auVar33 = vcmpps_avx(*(undefined1 (*) [16])(uVar11 + 0xe0),auVar32,2);
        auVar34 = vcmpps_avx(auVar32,*(undefined1 (*) [16])(uVar11 + 0xf0),1);
        auVar33 = vandps_avx(auVar33,auVar34);
        auVar33 = vandps_avx(auVar33,auVar38);
      }
      else {
        auVar33 = vcmpps_avx(auVar33,auVar38,2);
      }
      auVar33 = vpslld_avx(auVar33,0x1f);
      uVar12 = vmovmskps_avx(auVar33);
      if (uVar12 == 0) goto LAB_015efd4d;
      uVar12 = uVar12 & 0xff;
      lVar18 = 0;
      for (uVar19 = (ulong)uVar12; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
        lVar18 = lVar18 + 1;
      }
      uVar19 = *(ulong *)(uVar11 + lVar18 * 8);
      uVar12 = uVar12 - 1 & uVar12;
      uVar14 = (ulong)uVar12;
      if (uVar12 != 0) {
        do {
          *local_c00 = uVar19;
          local_c00 = local_c00 + 1;
          lVar18 = 0;
          for (uVar19 = uVar14; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
            lVar18 = lVar18 + 1;
          }
          uVar14 = uVar14 - 1 & uVar14;
          uVar19 = *(ulong *)(uVar11 + lVar18 * 8);
        } while (uVar14 != 0);
      }
    }
    uVar11 = uVar19 & 0xfffffffffffffff0;
    for (lVar18 = 0; lVar18 != (ulong)((uint)uVar19 & 0xf) - 8; lVar18 = lVar18 + 1) {
      lVar30 = lVar18 * 0x50;
      pSVar5 = context->scene;
      pGVar6 = (pSVar5->geometries).items[*(uint *)(uVar11 + 0x30 + lVar30)].ptr;
      fVar2 = (pGVar6->time_range).lower;
      fVar2 = pGVar6->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0xe0) - fVar2) / ((pGVar6->time_range).upper - fVar2));
      auVar33 = vroundss_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),9);
      auVar33 = vminss_avx(auVar33,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
      auVar44 = vmaxss_avx(ZEXT816(0),auVar33);
      lVar15 = (long)(int)auVar44._0_4_ * 0x38;
      uVar31 = (ulong)*(uint *)(uVar11 + 4 + lVar30);
      lVar7 = *(long *)(*(long *)&pGVar6[2].numPrimitives + lVar15);
      lVar15 = *(long *)(*(long *)&pGVar6[2].numPrimitives + 0x38 + lVar15);
      auVar33 = *(undefined1 (*) [16])(lVar7 + (ulong)*(uint *)(uVar11 + lVar30) * 4);
      uVar21 = (ulong)*(uint *)(uVar11 + 0x10 + lVar30);
      auVar38 = *(undefined1 (*) [16])(lVar7 + uVar21 * 4);
      uVar24 = (ulong)*(uint *)(uVar11 + 0x20 + lVar30);
      auVar43 = *(undefined1 (*) [16])(lVar7 + uVar24 * 4);
      auVar34 = *(undefined1 (*) [16])(lVar7 + uVar31 * 4);
      uVar25 = (ulong)*(uint *)(uVar11 + 0x14 + lVar30);
      auVar32 = *(undefined1 (*) [16])(lVar7 + uVar25 * 4);
      uVar26 = (ulong)*(uint *)(uVar11 + 0x24 + lVar30);
      auVar47 = *(undefined1 (*) [16])(lVar7 + uVar26 * 4);
      uVar22 = (ulong)*(uint *)(uVar11 + 8 + lVar30);
      auVar40 = *(undefined1 (*) [16])(lVar7 + uVar22 * 4);
      uVar14 = (ulong)*(uint *)(uVar11 + 0x18 + lVar30);
      auVar57 = *(undefined1 (*) [16])(lVar7 + uVar14 * 4);
      uVar27 = (ulong)*(uint *)(uVar11 + 0x28 + lVar30);
      auVar41 = *(undefined1 (*) [16])(lVar7 + uVar27 * 4);
      uVar28 = (ulong)*(uint *)(uVar11 + 0xc + lVar30);
      auVar49 = *(undefined1 (*) [16])(lVar7 + uVar28 * 4);
      uVar16 = (ulong)*(uint *)(uVar11 + 0x1c + lVar30);
      auVar35 = *(undefined1 (*) [16])(lVar7 + uVar16 * 4);
      uVar17 = (ulong)*(uint *)(uVar11 + 0x2c + lVar30);
      auVar36 = *(undefined1 (*) [16])(lVar7 + uVar17 * 4);
      auVar37 = *(undefined1 (*) [16])(lVar15 + (ulong)*(uint *)(uVar11 + lVar30) * 4);
      auVar51 = *(undefined1 (*) [16])(lVar15 + uVar21 * 4);
      fVar2 = fVar2 - auVar44._0_4_;
      auVar44 = vunpcklps_avx(auVar33,auVar40);
      auVar40 = vunpckhps_avx(auVar33,auVar40);
      auVar46 = vunpcklps_avx(auVar34,auVar49);
      auVar34 = vunpckhps_avx(auVar34,auVar49);
      auVar33 = *(undefined1 (*) [16])(lVar15 + uVar31 * 4);
      local_a50 = vunpcklps_avx(auVar40,auVar34);
      auVar49 = vunpcklps_avx(auVar44,auVar46);
      auVar40 = vunpckhps_avx(auVar44,auVar46);
      auVar44 = vunpcklps_avx(auVar38,auVar57);
      auVar34 = vunpckhps_avx(auVar38,auVar57);
      auVar57 = vunpcklps_avx(auVar32,auVar35);
      auVar32 = vunpckhps_avx(auVar32,auVar35);
      auVar38 = *(undefined1 (*) [16])(lVar15 + uVar22 * 4);
      local_a40 = vunpcklps_avx(auVar34,auVar32);
      auVar35 = vunpcklps_avx(auVar44,auVar57);
      local_a60 = vunpckhps_avx(auVar44,auVar57);
      auVar44 = vunpcklps_avx(auVar43,auVar41);
      auVar32 = vunpckhps_avx(auVar43,auVar41);
      auVar41 = vunpcklps_avx(auVar47,auVar36);
      auVar57 = vunpckhps_avx(auVar47,auVar36);
      auVar34 = *(undefined1 (*) [16])(lVar15 + uVar28 * 4);
      auVar36 = vunpcklps_avx(auVar32,auVar57);
      auVar46 = vunpcklps_avx(auVar44,auVar41);
      local_a30 = vunpckhps_avx(auVar44,auVar41);
      auVar32 = vunpcklps_avx(auVar37,auVar38);
      auVar38 = vunpckhps_avx(auVar37,auVar38);
      auVar57 = vunpcklps_avx(auVar33,auVar34);
      auVar34 = vunpckhps_avx(auVar33,auVar34);
      auVar33 = *(undefined1 (*) [16])(lVar15 + uVar14 * 4);
      auVar41 = vunpcklps_avx(auVar38,auVar34);
      auVar37 = vunpcklps_avx(auVar32,auVar57);
      auVar34 = vunpckhps_avx(auVar32,auVar57);
      auVar57 = vunpcklps_avx(auVar51,auVar33);
      auVar32 = vunpckhps_avx(auVar51,auVar33);
      auVar33 = *(undefined1 (*) [16])(lVar15 + uVar25 * 4);
      auVar38 = *(undefined1 (*) [16])(lVar15 + uVar16 * 4);
      auVar51 = vunpcklps_avx(auVar33,auVar38);
      auVar33 = vunpckhps_avx(auVar33,auVar38);
      auVar44 = vunpcklps_avx(auVar32,auVar33);
      auVar43 = vunpcklps_avx(auVar57,auVar51);
      auVar32 = vunpckhps_avx(auVar57,auVar51);
      auVar33 = *(undefined1 (*) [16])(lVar15 + uVar24 * 4);
      auVar38 = *(undefined1 (*) [16])(lVar15 + uVar27 * 4);
      auVar51 = vunpcklps_avx(auVar33,auVar38);
      auVar57 = vunpckhps_avx(auVar33,auVar38);
      auVar33 = *(undefined1 (*) [16])(lVar15 + uVar26 * 4);
      auVar38 = *(undefined1 (*) [16])(lVar15 + uVar17 * 4);
      auVar47 = vunpcklps_avx(auVar33,auVar38);
      auVar33 = vunpckhps_avx(auVar33,auVar38);
      auVar38 = vunpcklps_avx(auVar57,auVar33);
      auVar57 = vunpcklps_avx(auVar51,auVar47);
      auVar33 = vunpckhps_avx(auVar51,auVar47);
      fVar60 = 1.0 - fVar2;
      auVar76._4_4_ = fVar60;
      auVar76._0_4_ = fVar60;
      auVar76._8_4_ = fVar60;
      auVar76._12_4_ = fVar60;
      auVar51._0_4_ = fVar2 * auVar37._0_4_;
      auVar51._4_4_ = fVar2 * auVar37._4_4_;
      auVar51._8_4_ = fVar2 * auVar37._8_4_;
      auVar51._12_4_ = fVar2 * auVar37._12_4_;
      auVar49 = vfmadd231ps_fma(auVar51,auVar76,auVar49);
      auVar56._0_4_ = fVar2 * auVar34._0_4_;
      auVar56._4_4_ = fVar2 * auVar34._4_4_;
      auVar56._8_4_ = fVar2 * auVar34._8_4_;
      auVar56._12_4_ = fVar2 * auVar34._12_4_;
      auVar37 = vfmadd231ps_fma(auVar56,auVar76,auVar40);
      auVar61._0_4_ = fVar2 * auVar41._0_4_;
      auVar61._4_4_ = fVar2 * auVar41._4_4_;
      auVar61._8_4_ = fVar2 * auVar41._8_4_;
      auVar61._12_4_ = fVar2 * auVar41._12_4_;
      auVar51 = vfmadd231ps_fma(auVar61,auVar76,local_a50);
      auVar34._0_4_ = fVar2 * auVar43._0_4_;
      auVar34._4_4_ = fVar2 * auVar43._4_4_;
      auVar34._8_4_ = fVar2 * auVar43._8_4_;
      auVar34._12_4_ = fVar2 * auVar43._12_4_;
      auVar34 = vfmadd231ps_fma(auVar34,auVar76,auVar35);
      auVar40._0_4_ = fVar2 * auVar32._0_4_;
      auVar40._4_4_ = fVar2 * auVar32._4_4_;
      auVar40._8_4_ = fVar2 * auVar32._8_4_;
      auVar40._12_4_ = fVar2 * auVar32._12_4_;
      auVar32 = vfmadd231ps_fma(auVar40,auVar76,local_a60);
      auVar43._0_4_ = fVar2 * auVar44._0_4_;
      auVar43._4_4_ = fVar2 * auVar44._4_4_;
      auVar43._8_4_ = fVar2 * auVar44._8_4_;
      auVar43._12_4_ = fVar2 * auVar44._12_4_;
      auVar40 = vfmadd231ps_fma(auVar43,auVar76,local_a40);
      puVar1 = (undefined8 *)(uVar11 + 0x30 + lVar30);
      local_a10 = *puVar1;
      uStack_a08 = puVar1[1];
      puVar1 = (undefined8 *)(uVar11 + 0x40 + lVar30);
      auVar47._0_4_ = fVar2 * auVar57._0_4_;
      auVar47._4_4_ = fVar2 * auVar57._4_4_;
      auVar47._8_4_ = fVar2 * auVar57._8_4_;
      auVar47._12_4_ = fVar2 * auVar57._12_4_;
      auVar72._0_4_ = fVar2 * auVar33._0_4_;
      auVar72._4_4_ = fVar2 * auVar33._4_4_;
      auVar72._8_4_ = fVar2 * auVar33._8_4_;
      auVar72._12_4_ = fVar2 * auVar33._12_4_;
      auVar78._0_4_ = fVar2 * auVar38._0_4_;
      auVar78._4_4_ = fVar2 * auVar38._4_4_;
      auVar78._8_4_ = fVar2 * auVar38._8_4_;
      auVar78._12_4_ = fVar2 * auVar38._12_4_;
      auVar57 = vfmadd231ps_fma(auVar47,auVar76,auVar46);
      auVar41 = vfmadd231ps_fma(auVar72,auVar76,local_a30);
      auVar35 = vfmadd231ps_fma(auVar78,auVar76,auVar36);
      local_a20 = *puVar1;
      uStack_a18 = puVar1[1];
      auVar38 = vsubps_avx(auVar49,auVar34);
      auVar33 = vsubps_avx(auVar37,auVar32);
      auVar34 = vsubps_avx(auVar51,auVar40);
      auVar32 = vsubps_avx(auVar57,auVar49);
      auVar40 = vsubps_avx(auVar41,auVar37);
      auVar57 = vsubps_avx(auVar35,auVar51);
      auVar41._0_4_ = auVar33._0_4_ * auVar57._0_4_;
      auVar41._4_4_ = auVar33._4_4_ * auVar57._4_4_;
      auVar41._8_4_ = auVar33._8_4_ * auVar57._8_4_;
      auVar41._12_4_ = auVar33._12_4_ * auVar57._12_4_;
      local_970 = vfmsub231ps_fma(auVar41,auVar40,auVar34);
      auVar46._0_4_ = auVar34._0_4_ * auVar32._0_4_;
      auVar46._4_4_ = auVar34._4_4_ * auVar32._4_4_;
      auVar46._8_4_ = auVar34._8_4_ * auVar32._8_4_;
      auVar46._12_4_ = auVar34._12_4_ * auVar32._12_4_;
      local_960 = vfmsub231ps_fma(auVar46,auVar57,auVar38);
      uVar3 = *(undefined4 *)(ray + k * 4);
      auVar44._4_4_ = uVar3;
      auVar44._0_4_ = uVar3;
      auVar44._8_4_ = uVar3;
      auVar44._12_4_ = uVar3;
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar48._4_4_ = uVar3;
      auVar48._0_4_ = uVar3;
      auVar48._8_4_ = uVar3;
      auVar48._12_4_ = uVar3;
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar35._4_4_ = uVar3;
      auVar35._0_4_ = uVar3;
      auVar35._8_4_ = uVar3;
      auVar35._12_4_ = uVar3;
      fVar2 = *(float *)(ray + k * 4 + 0x80);
      auVar77._4_4_ = fVar2;
      auVar77._0_4_ = fVar2;
      auVar77._8_4_ = fVar2;
      auVar77._12_4_ = fVar2;
      auVar41 = vsubps_avx(auVar49,auVar44);
      fVar60 = *(float *)(ray + k * 4 + 0xa0);
      auVar79._4_4_ = fVar60;
      auVar79._0_4_ = fVar60;
      auVar79._8_4_ = fVar60;
      auVar79._12_4_ = fVar60;
      auVar49 = vsubps_avx(auVar37,auVar48);
      fVar65 = *(float *)(ray + k * 4 + 0xc0);
      auVar80._4_4_ = fVar65;
      auVar80._0_4_ = fVar65;
      auVar80._8_4_ = fVar65;
      auVar80._12_4_ = fVar65;
      auVar35 = vsubps_avx(auVar51,auVar35);
      auVar36._0_4_ = fVar2 * auVar49._0_4_;
      auVar36._4_4_ = fVar2 * auVar49._4_4_;
      auVar36._8_4_ = fVar2 * auVar49._8_4_;
      auVar36._12_4_ = fVar2 * auVar49._12_4_;
      auVar36 = vfmsub231ps_fma(auVar36,auVar41,auVar79);
      auVar62._0_4_ = auVar57._0_4_ * auVar36._0_4_;
      auVar62._4_4_ = auVar57._4_4_ * auVar36._4_4_;
      auVar62._8_4_ = auVar57._8_4_ * auVar36._8_4_;
      auVar62._12_4_ = auVar57._12_4_ * auVar36._12_4_;
      auVar37._0_4_ = auVar34._0_4_ * auVar36._0_4_;
      auVar37._4_4_ = auVar34._4_4_ * auVar36._4_4_;
      auVar37._8_4_ = auVar34._8_4_ * auVar36._8_4_;
      auVar37._12_4_ = auVar34._12_4_ * auVar36._12_4_;
      auVar57._0_4_ = fVar65 * auVar41._0_4_;
      auVar57._4_4_ = fVar65 * auVar41._4_4_;
      auVar57._8_4_ = fVar65 * auVar41._8_4_;
      auVar57._12_4_ = fVar65 * auVar41._12_4_;
      auVar57 = vfmsub231ps_fma(auVar57,auVar35,auVar77);
      auVar34 = vfmadd231ps_fma(auVar62,auVar57,auVar40);
      auVar57 = vfmadd231ps_fma(auVar37,auVar33,auVar57);
      auVar58._0_4_ = auVar40._0_4_ * auVar38._0_4_;
      auVar58._4_4_ = auVar40._4_4_ * auVar38._4_4_;
      auVar58._8_4_ = auVar40._8_4_ * auVar38._8_4_;
      auVar58._12_4_ = auVar40._12_4_ * auVar38._12_4_;
      local_950 = vfmsub231ps_fma(auVar58,auVar32,auVar33);
      auVar33._0_4_ = fVar60 * auVar35._0_4_;
      auVar33._4_4_ = fVar60 * auVar35._4_4_;
      auVar33._8_4_ = fVar60 * auVar35._8_4_;
      auVar33._12_4_ = fVar60 * auVar35._12_4_;
      auVar36 = vfmsub231ps_fma(auVar33,auVar49,auVar80);
      auVar74._0_4_ = fVar65 * local_950._0_4_;
      auVar74._4_4_ = fVar65 * local_950._4_4_;
      auVar74._8_4_ = fVar65 * local_950._8_4_;
      auVar74._12_4_ = fVar65 * local_950._12_4_;
      auVar33 = vfmadd231ps_fma(auVar74,local_960,auVar79);
      auVar40 = vfmadd231ps_fma(auVar33,local_970,auVar77);
      auVar34 = vfmadd231ps_fma(auVar34,auVar36,auVar32);
      auVar33 = vandps_avx(auVar40,local_a70);
      uVar12 = auVar33._0_4_;
      local_a00._0_4_ = (float)(uVar12 ^ auVar34._0_4_);
      uVar69 = auVar33._4_4_;
      local_a00._4_4_ = (float)(uVar69 ^ auVar34._4_4_);
      uVar70 = auVar33._8_4_;
      local_a00._8_4_ = (float)(uVar70 ^ auVar34._8_4_);
      uVar71 = auVar33._12_4_;
      local_a00._12_4_ = (float)(uVar71 ^ auVar34._12_4_);
      auVar33 = vfmadd231ps_fma(auVar57,auVar38,auVar36);
      local_9f0._0_4_ = (float)(uVar12 ^ auVar33._0_4_);
      local_9f0._4_4_ = (float)(uVar69 ^ auVar33._4_4_);
      local_9f0._8_4_ = (float)(uVar70 ^ auVar33._8_4_);
      local_9f0._12_4_ = (float)(uVar71 ^ auVar33._12_4_);
      auVar34 = ZEXT816(0) << 0x20;
      auVar33 = vcmpps_avx(local_a00,auVar34,5);
      auVar38 = vcmpps_avx(local_9f0,auVar34,5);
      auVar33 = vandps_avx(auVar38,auVar33);
      auVar63._8_4_ = 0x7fffffff;
      auVar63._0_8_ = 0x7fffffff7fffffff;
      auVar63._12_4_ = 0x7fffffff;
      local_9d0 = vandps_avx(auVar40,auVar63);
      auVar38 = vcmpps_avx(auVar40,auVar34,4);
      auVar33 = vandps_avx(auVar38,auVar33);
      auVar38._0_4_ = local_a00._0_4_ + local_9f0._0_4_;
      auVar38._4_4_ = local_a00._4_4_ + local_9f0._4_4_;
      auVar38._8_4_ = local_a00._8_4_ + local_9f0._8_4_;
      auVar38._12_4_ = local_a00._12_4_ + local_9f0._12_4_;
      auVar38 = vcmpps_avx(auVar38,local_9d0,2);
      auVar34 = auVar38 & auVar33;
      if ((((auVar34 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar34 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar34 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar34[0xf] < '\0'
         ) {
        auVar33 = vandps_avx(auVar33,auVar38);
        auVar52._0_4_ = local_950._0_4_ * auVar35._0_4_;
        auVar52._4_4_ = local_950._4_4_ * auVar35._4_4_;
        auVar52._8_4_ = local_950._8_4_ * auVar35._8_4_;
        auVar52._12_4_ = local_950._12_4_ * auVar35._12_4_;
        auVar38 = vfmadd213ps_fma(auVar49,local_960,auVar52);
        auVar38 = vfmadd213ps_fma(auVar41,local_970,auVar38);
        local_9e0._0_4_ = (float)(uVar12 ^ auVar38._0_4_);
        local_9e0._4_4_ = (float)(uVar69 ^ auVar38._4_4_);
        local_9e0._8_4_ = (float)(uVar70 ^ auVar38._8_4_);
        local_9e0._12_4_ = (float)(uVar71 ^ auVar38._12_4_);
        fVar2 = *(float *)(ray + k * 4 + 0x60);
        auVar49._0_4_ = local_9d0._0_4_ * fVar2;
        auVar49._4_4_ = local_9d0._4_4_ * fVar2;
        auVar49._8_4_ = local_9d0._8_4_ * fVar2;
        auVar49._12_4_ = local_9d0._12_4_ * fVar2;
        auVar38 = vcmpps_avx(auVar49,local_9e0,1);
        fVar2 = *(float *)(ray + k * 4 + 0x100);
        auVar53._0_4_ = local_9d0._0_4_ * fVar2;
        auVar53._4_4_ = local_9d0._4_4_ * fVar2;
        auVar53._8_4_ = local_9d0._8_4_ * fVar2;
        auVar53._12_4_ = local_9d0._12_4_ * fVar2;
        auVar34 = vcmpps_avx(local_9e0,auVar53,2);
        auVar38 = vandps_avx(auVar38,auVar34);
        local_9b0 = vandps_avx(auVar38,auVar33);
        uVar12 = vmovmskps_avx(local_9b0);
        if (uVar12 != 0) {
          auVar33 = vrcpps_avx(local_9d0);
          auVar42._8_4_ = 0x3f800000;
          auVar42._0_8_ = 0x3f8000003f800000;
          auVar42._12_4_ = 0x3f800000;
          auVar38 = vfnmadd213ps_fma(local_9d0,auVar33,auVar42);
          auVar33 = vfmadd132ps_fma(auVar38,auVar33,auVar33);
          fVar60 = auVar33._0_4_;
          fVar65 = auVar33._4_4_;
          fVar66 = auVar33._8_4_;
          fVar67 = auVar33._12_4_;
          local_980[0] = fVar60 * local_9e0._0_4_;
          local_980[1] = fVar65 * local_9e0._4_4_;
          local_980[2] = fVar66 * local_9e0._8_4_;
          local_980[3] = fVar67 * local_9e0._12_4_;
          local_9a0[0] = fVar60 * local_a00._0_4_;
          local_9a0[1] = fVar65 * local_a00._4_4_;
          local_9a0[2] = fVar66 * local_a00._8_4_;
          local_9a0[3] = fVar67 * local_a00._12_4_;
          local_990._0_4_ = fVar60 * local_9f0._0_4_;
          local_990._4_4_ = fVar65 * local_9f0._4_4_;
          local_990._8_4_ = fVar66 * local_9f0._8_4_;
          local_990._12_4_ = fVar67 * local_9f0._12_4_;
          uVar14 = (ulong)(uVar12 & 0xff);
          do {
            uVar16 = 0;
            for (uVar17 = uVar14; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
              uVar16 = uVar16 + 1;
            }
            uVar12 = *(uint *)((long)&local_a10 + uVar16 * 4);
            pGVar6 = (pSVar5->geometries).items[uVar12].ptr;
            if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                uVar17 = (ulong)(uint)((int)uVar16 * 4);
                uVar3 = *(undefined4 *)((long)local_9a0 + uVar17);
                local_8c0._4_4_ = uVar3;
                local_8c0._0_4_ = uVar3;
                local_8c0._8_4_ = uVar3;
                local_8c0._12_4_ = uVar3;
                local_8c0._16_4_ = uVar3;
                local_8c0._20_4_ = uVar3;
                local_8c0._24_4_ = uVar3;
                local_8c0._28_4_ = uVar3;
                local_8a0 = *(undefined4 *)(local_990 + uVar17);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)((long)local_980 + uVar17);
                local_b50.context = context->user;
                uVar3 = *(undefined4 *)((long)&local_a20 + uVar17);
                local_880._4_4_ = uVar3;
                local_880._0_4_ = uVar3;
                local_880._8_4_ = uVar3;
                local_880._12_4_ = uVar3;
                local_880._16_4_ = uVar3;
                local_880._20_4_ = uVar3;
                local_880._24_4_ = uVar3;
                local_880._28_4_ = uVar3;
                uVar3 = *(undefined4 *)(local_970 + uVar17);
                uVar4 = *(undefined4 *)(local_960 + uVar17);
                local_900._4_4_ = uVar4;
                local_900._0_4_ = uVar4;
                local_900._8_4_ = uVar4;
                local_900._12_4_ = uVar4;
                local_900._16_4_ = uVar4;
                local_900._20_4_ = uVar4;
                local_900._24_4_ = uVar4;
                local_900._28_4_ = uVar4;
                uVar4 = *(undefined4 *)(local_950 + uVar17);
                local_8e0._4_4_ = uVar4;
                local_8e0._0_4_ = uVar4;
                local_8e0._8_4_ = uVar4;
                local_8e0._12_4_ = uVar4;
                local_8e0._16_4_ = uVar4;
                local_8e0._20_4_ = uVar4;
                local_8e0._24_4_ = uVar4;
                local_8e0._28_4_ = uVar4;
                local_860._4_4_ = uVar12;
                local_860._0_4_ = uVar12;
                local_860._8_4_ = uVar12;
                local_860._12_4_ = uVar12;
                local_860._16_4_ = uVar12;
                local_860._20_4_ = uVar12;
                local_860._24_4_ = uVar12;
                local_860._28_4_ = uVar12;
                local_920[0] = (RTCHitN)(char)uVar3;
                local_920[1] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_920[2] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_920[3] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_920[4] = (RTCHitN)(char)uVar3;
                local_920[5] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_920[6] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_920[7] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_920[8] = (RTCHitN)(char)uVar3;
                local_920[9] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_920[10] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_920[0xb] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_920[0xc] = (RTCHitN)(char)uVar3;
                local_920[0xd] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_920[0xe] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_920[0xf] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_920[0x10] = (RTCHitN)(char)uVar3;
                local_920[0x11] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_920[0x12] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_920[0x13] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_920[0x14] = (RTCHitN)(char)uVar3;
                local_920[0x15] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_920[0x16] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_920[0x17] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_920[0x18] = (RTCHitN)(char)uVar3;
                local_920[0x19] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_920[0x1a] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_920[0x1b] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_920[0x1c] = (RTCHitN)(char)uVar3;
                local_920[0x1d] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_920[0x1e] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_920[0x1f] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                uStack_89c = local_8a0;
                uStack_898 = local_8a0;
                uStack_894 = local_8a0;
                uStack_890 = local_8a0;
                uStack_88c = local_8a0;
                uStack_888 = local_8a0;
                uStack_884 = local_8a0;
                vpcmpeqd_avx2(local_8c0,local_8c0);
                uStack_83c = (local_b50.context)->instID[0];
                local_840 = uStack_83c;
                uStack_838 = uStack_83c;
                uStack_834 = uStack_83c;
                uStack_830 = uStack_83c;
                uStack_82c = uStack_83c;
                uStack_828 = uStack_83c;
                uStack_824 = uStack_83c;
                uStack_81c = (local_b50.context)->instPrimID[0];
                local_820 = uStack_81c;
                uStack_818 = uStack_81c;
                uStack_814 = uStack_81c;
                uStack_810 = uStack_81c;
                uStack_80c = uStack_81c;
                uStack_808 = uStack_81c;
                uStack_804 = uStack_81c;
                local_b20 = local_940;
                local_b50.valid = (int *)local_b20;
                local_b50.geometryUserPtr = pGVar6->userPtr;
                local_b50.hit = local_920;
                local_b50.N = 8;
                local_b50.ray = (RTCRayN *)ray;
                if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar6->occlusionFilterN)(&local_b50);
                }
                auVar9 = vpcmpeqd_avx2(local_b20,_DAT_01f7b000);
                auVar39 = _DAT_01f7b020 & ~auVar9;
                if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar39 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar39 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar39 >> 0x7f,0) == '\0') &&
                      (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar39 >> 0xbf,0) == '\0') &&
                    (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar39[0x1f]) {
                  auVar9 = auVar9 ^ _DAT_01f7b020;
                }
                else {
                  p_Var8 = context->args->filter;
                  if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var8)(&local_b50);
                  }
                  auVar39 = vpcmpeqd_avx2(local_b20,_DAT_01f7b000);
                  auVar9 = auVar39 ^ _DAT_01f7b020;
                  auVar45._8_4_ = 0xff800000;
                  auVar45._0_8_ = 0xff800000ff800000;
                  auVar45._12_4_ = 0xff800000;
                  auVar45._16_4_ = 0xff800000;
                  auVar45._20_4_ = 0xff800000;
                  auVar45._24_4_ = 0xff800000;
                  auVar45._28_4_ = 0xff800000;
                  auVar39 = vblendvps_avx(auVar45,*(undefined1 (*) [32])(local_b50.ray + 0x100),
                                          auVar39);
                  *(undefined1 (*) [32])(local_b50.ray + 0x100) = auVar39;
                }
                if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar9 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar9 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar9 >> 0x7f,0) == '\0') &&
                      (auVar9 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar9 >> 0xbf,0) == '\0') &&
                    (auVar9 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar9[0x1f]) {
                  *(float *)(ray + k * 4 + 0x100) = fVar2;
                  goto LAB_015f0680;
                }
              }
              *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
              goto LAB_015f0755;
            }
LAB_015f0680:
            uVar14 = uVar14 ^ 1L << (uVar16 & 0x3f);
          } while (uVar14 != 0);
        }
      }
      auVar50 = ZEXT1664(local_a80);
      auVar54 = ZEXT1664(local_a90);
      auVar55 = ZEXT1664(local_aa0);
      auVar59 = ZEXT1664(local_ab0);
      auVar64 = ZEXT1664(local_ac0);
      auVar68 = ZEXT1664(local_ad0);
      auVar73 = ZEXT1664(local_ae0);
      auVar75 = ZEXT1664(local_af0);
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }